

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::_validate(App *this)

{
  bool bVar1;
  InvalidError *this_00;
  reference this_01;
  pointer this_02;
  App_p *app;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range2;
  string local_50;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_28;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_20;
  difference_type local_18;
  difference_type count;
  App *this_local;
  
  count = (difference_type)this;
  local_20 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_28 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_18 = ::std::
             count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                       (local_20,local_28);
  if (1 < local_18) {
    this_00 = (InvalidError *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_50,(string *)&this->name_);
    InvalidError::InvalidError(this_00,&local_50);
    __cxa_throw(this_00,&InvalidError::typeinfo,InvalidError::~InvalidError);
  }
  __end2 = std::
           vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ::begin(&this->subcommands_);
  app = (App_p *)std::
                 vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                 ::end(&this->subcommands_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                *)&app);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
              ::operator*(&__end2);
    this_02 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(this_01);
    _validate(this_02);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void _validate() const {
        auto count = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_expected() == -1 && opt->get_positional();
        });
        if(count > 1)
            throw InvalidError(name_);
        for(const App_p &app : subcommands_)
            app->_validate();
    }